

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O1

int ClampBits(int width,int height,int bits,int min_bits,int max_bits,int image_size_max)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  
  uVar3 = 9;
  if (bits < 9) {
    uVar3 = bits;
  }
  uVar2 = 2;
  if (2 < (int)uVar3) {
    uVar2 = uVar3;
  }
  bVar1 = (byte)uVar2;
  iVar4 = 1 << (bVar1 & 0x1f);
  iVar4 = ((iVar4 + height) - 1U >> (bVar1 & 0x1f)) * ((iVar4 + width) - 1U >> (bVar1 & 0x1f));
  uVar3 = uVar2;
  if (bits < 9) {
    do {
      uVar3 = uVar2;
      if (iVar4 <= min_bits) break;
      iVar4 = 2 << ((byte)uVar2 & 0x1f);
      uVar3 = uVar2 + 1;
      iVar4 = ((uint)(iVar4 + height + -1) >> ((byte)uVar3 & 0x1f)) *
              ((uint)(iVar4 + width + -1) >> ((byte)uVar3 & 0x1f));
      bVar5 = uVar2 < 8;
      uVar2 = uVar3;
    } while (bVar5);
  }
  bVar5 = iVar4 == 1;
  while( true ) {
    uVar2 = uVar3;
    if ((int)uVar2 < 3) {
      return uVar2;
    }
    if (!bVar5) break;
    bVar1 = (byte)(uVar2 - 1);
    iVar4 = 1 << (bVar1 & 0x1f);
    bVar5 = true;
    uVar3 = uVar2 - 1;
    if (((uint)(iVar4 + height + -1) >> (bVar1 & 0x1f)) *
        ((uint)(iVar4 + width + -1) >> (bVar1 & 0x1f)) != 1) {
      return uVar2;
    }
  }
  return uVar2;
}

Assistant:

static int ClampBits(int width, int height, int bits, int min_bits,
                     int max_bits, int image_size_max) {
  int image_size;
  bits = (bits < min_bits) ? min_bits : (bits > max_bits) ? max_bits : bits;
  image_size = VP8LSubSampleSize(width, bits) * VP8LSubSampleSize(height, bits);
  while (bits < max_bits && image_size > image_size_max) {
    ++bits;
    image_size =
        VP8LSubSampleSize(width, bits) * VP8LSubSampleSize(height, bits);
  }
  // In case the bits reduce the image too much, choose the smallest value
  // setting the histogram image size to 1.
  while (bits > min_bits && image_size == 1) {
    image_size = VP8LSubSampleSize(width, bits - 1) *
                 VP8LSubSampleSize(height, bits - 1);
    if (image_size != 1) break;
    --bits;
  }
  return bits;
}